

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int fibonacci_direct(int n)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (-1 < n) {
    dVar2 = pow(1.618034,(double)n);
    dVar3 = pow(-0.618034,(double)n);
    dVar2 = (dVar2 - dVar3) / 2.23606797749979;
    iVar1 = (int)(ABS(dVar2) + 0.5);
    if (dVar2 < 0.0) {
      iVar1 = -iVar1;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int fibonacci_direct ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    FIBONACCI_DIRECT computes the N-th Fibonacci number directly.
//
//  Discussion:
//
//    The formula is:
//
//      F(N) = ( PHIP**N - PHIM**N ) / sqrt(5)
//
//    where
//
//      PHIP = ( 1 + sqrt(5) ) / 2,
//      PHIM = ( 1 - sqrt(5) ) / 2.
//
//  Example:
//
//     N   F
//    --  --
//     0   0
//     1   1
//     2   1
//     3   2
//     4   3
//     5   5
//     6   8
//     7  13
//     8  21
//     9  34
//    10  55
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the index of the Fibonacci number to compute.
//    N should be nonnegative.
//
//    Output, int FIBONACCI_DIRECT, the value of the N-th Fibonacci number.
//
{
  int f;
  double sqrt5 = 2.236068;
  double phim = ( 1.0 - sqrt5 ) / 2.0;
  double phip = ( 1.0 + sqrt5 ) / 2.0;

  if ( n < 0 )
  {
    f = 0;
  }
  else
  {
    f = r8_nint ( ( pow ( phip, n ) - pow ( phim, n ) ) / sqrt ( 5.0 ) );
  }

  return f;
}